

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Eltwise_x86_avx512::forward
          (Eltwise_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  Mat *m;
  Mat *this_00;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ulong uVar4;
  uint uVar5;
  undefined1 (*pauVar6) [64];
  pointer pMVar7;
  undefined1 (*pauVar8) [64];
  ulong uVar9;
  undefined1 (*pauVar10) [64];
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float fVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar22 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 in_ZMM3 [64];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar1 = m->c;
  uVar15 = (ulong)uVar1;
  uVar5 = m->h * m->w * m->d * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar11 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if ((this->super_Eltwise).op_type == 0) {
      if (0 < (int)uVar1) {
        pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = 0;
        do {
          pauVar6 = (undefined1 (*) [64])(m->cstep * uVar4 * m->elemsize + (long)m->data);
          pauVar8 = (undefined1 (*) [64])
                    (pMVar7[1].cstep * uVar4 * pMVar7[1].elemsize + (long)pMVar7[1].data);
          pauVar10 = (undefined1 (*) [64])
                     (this_00->cstep * uVar4 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar5 < 0x10) {
            uVar14 = 0;
          }
          else {
            iVar11 = 0xf;
            do {
              auVar16 = vmulps_avx512f(*pauVar8,*pauVar6);
              *pauVar10 = auVar16;
              pauVar6 = pauVar6 + 1;
              pauVar8 = pauVar8 + 1;
              pauVar10 = pauVar10 + 1;
              iVar11 = iVar11 + 0x10;
              uVar14 = uVar5 & 0xfffffff0;
            } while (iVar11 < (int)uVar5);
          }
          uVar13 = uVar14 | 7;
          while ((int)uVar13 < (int)uVar5) {
            auVar2._4_4_ = *(float *)(*pauVar8 + 4) * *(float *)(*pauVar6 + 4);
            auVar2._0_4_ = *(float *)*pauVar8 * *(float *)*pauVar6;
            auVar2._8_4_ = *(float *)(*pauVar8 + 8) * *(float *)(*pauVar6 + 8);
            auVar2._12_4_ = *(float *)(*pauVar8 + 0xc) * *(float *)(*pauVar6 + 0xc);
            auVar2._16_4_ = *(float *)(*pauVar8 + 0x10) * *(float *)(*pauVar6 + 0x10);
            auVar2._20_4_ = *(float *)(*pauVar8 + 0x14) * *(float *)(*pauVar6 + 0x14);
            auVar2._24_4_ = *(float *)(*pauVar8 + 0x18) * *(float *)(*pauVar6 + 0x18);
            auVar2._28_4_ = *(undefined4 *)(*pauVar8 + 0x1c);
            *(undefined1 (*) [32])*pauVar10 = auVar2;
            pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x20);
            pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
            pauVar10 = (undefined1 (*) [64])((long)*pauVar10 + 0x20);
            uVar13 = uVar14 + 0xf;
            uVar14 = uVar14 + 8;
          }
          uVar13 = uVar14 | 3;
          while ((int)uVar13 < (int)uVar5) {
            auVar20._0_4_ = *(float *)*pauVar8 * *(float *)*pauVar6;
            auVar20._4_4_ = *(float *)(*pauVar8 + 4) * *(float *)(*pauVar6 + 4);
            auVar20._8_4_ = *(float *)(*pauVar8 + 8) * *(float *)(*pauVar6 + 8);
            auVar20._12_4_ = *(float *)(*pauVar8 + 0xc) * *(float *)(*pauVar6 + 0xc);
            *(undefined1 (*) [16])*pauVar10 = auVar20;
            pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x10);
            pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
            pauVar10 = (undefined1 (*) [64])((long)*pauVar10 + 0x10);
            uVar13 = uVar14 + 7;
            uVar14 = uVar14 + 4;
          }
          if (uVar5 - uVar14 != 0 && (int)uVar14 <= (int)uVar5) {
            lVar12 = 0;
            do {
              *(float *)((long)*pauVar10 + lVar12 * 4) =
                   *(float *)(*pauVar8 + lVar12 * 4) * *(float *)(*pauVar6 + lVar12 * 4);
              lVar12 = lVar12 + 1;
            } while (uVar5 - uVar14 != (int)lVar12);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar15);
      }
      pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar7 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar4 = 2;
        do {
          if (0 < (int)uVar1) {
            pMVar7 = pMVar7 + uVar4;
            uVar9 = 0;
            do {
              pauVar6 = (undefined1 (*) [64])
                        (pMVar7->cstep * uVar9 * pMVar7->elemsize + (long)pMVar7->data);
              pauVar8 = (undefined1 (*) [64])
                        (this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
              uVar14 = 0;
              if (0xf < (int)uVar5) {
                iVar11 = 0xf;
                do {
                  auVar16 = vmulps_avx512f(*pauVar6,*pauVar8);
                  *pauVar8 = auVar16;
                  pauVar6 = pauVar6 + 1;
                  pauVar8 = pauVar8 + 1;
                  iVar11 = iVar11 + 0x10;
                  uVar14 = uVar5 & 0xfffffff0;
                } while (iVar11 < (int)uVar5);
              }
              uVar13 = uVar14 | 7;
              while ((int)uVar13 < (int)uVar5) {
                auVar3._4_4_ = *(float *)(*pauVar6 + 4) * *(float *)(*pauVar8 + 4);
                auVar3._0_4_ = *(float *)*pauVar6 * *(float *)*pauVar8;
                auVar3._8_4_ = *(float *)(*pauVar6 + 8) * *(float *)(*pauVar8 + 8);
                auVar3._12_4_ = *(float *)(*pauVar6 + 0xc) * *(float *)(*pauVar8 + 0xc);
                auVar3._16_4_ = *(float *)(*pauVar6 + 0x10) * *(float *)(*pauVar8 + 0x10);
                auVar3._20_4_ = *(float *)(*pauVar6 + 0x14) * *(float *)(*pauVar8 + 0x14);
                auVar3._24_4_ = *(float *)(*pauVar6 + 0x18) * *(float *)(*pauVar8 + 0x18);
                auVar3._28_4_ = *(undefined4 *)(*pauVar6 + 0x1c);
                *(undefined1 (*) [32])*pauVar8 = auVar3;
                pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x20);
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
                uVar13 = uVar14 + 0xf;
                uVar14 = uVar14 + 8;
              }
              uVar13 = uVar14 | 3;
              while ((int)uVar13 < (int)uVar5) {
                auVar21._0_4_ = *(float *)*pauVar6 * *(float *)*pauVar8;
                auVar21._4_4_ = *(float *)(*pauVar6 + 4) * *(float *)(*pauVar8 + 4);
                auVar21._8_4_ = *(float *)(*pauVar6 + 8) * *(float *)(*pauVar8 + 8);
                auVar21._12_4_ = *(float *)(*pauVar6 + 0xc) * *(float *)(*pauVar8 + 0xc);
                *(undefined1 (*) [16])*pauVar8 = auVar21;
                pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x10);
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
                uVar13 = uVar14 + 7;
                uVar14 = uVar14 + 4;
              }
              if (uVar5 - uVar14 != 0 && (int)uVar14 <= (int)uVar5) {
                lVar12 = 0;
                do {
                  *(float *)(*pauVar8 + lVar12 * 4) =
                       *(float *)(*pauVar8 + lVar12 * 4) * *(float *)(*pauVar6 + lVar12 * 4);
                  lVar12 = lVar12 + 1;
                } while (uVar5 - uVar14 != (int)lVar12);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar15);
          }
          uVar4 = uVar4 + 1;
          pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        } while (uVar4 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7 >>
                                 3) * -0x71c71c71c71c71c7));
      }
    }
    if ((this->super_Eltwise).op_type == 1) {
      pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->super_Eltwise).coeffs.w == 0) {
        if (0 < (int)uVar1) {
          uVar4 = 0;
          do {
            pauVar6 = (undefined1 (*) [64])(m->cstep * uVar4 * m->elemsize + (long)m->data);
            pauVar8 = (undefined1 (*) [64])
                      (pMVar7[1].cstep * uVar4 * pMVar7[1].elemsize + (long)pMVar7[1].data);
            pauVar10 = (undefined1 (*) [64])
                       (this_00->cstep * uVar4 * this_00->elemsize + (long)this_00->data);
            if ((int)uVar5 < 0x10) {
              uVar14 = 0;
            }
            else {
              iVar11 = 0xf;
              do {
                auVar16 = vaddps_avx512f(*pauVar8,*pauVar6);
                *pauVar10 = auVar16;
                pauVar6 = pauVar6 + 1;
                pauVar8 = pauVar8 + 1;
                pauVar10 = pauVar10 + 1;
                iVar11 = iVar11 + 0x10;
                uVar14 = uVar5 & 0xfffffff0;
              } while (iVar11 < (int)uVar5);
            }
            uVar13 = uVar14 | 7;
            while ((int)uVar13 < (int)uVar5) {
              auVar25._0_4_ = *(float *)*pauVar8 + *(float *)*pauVar6;
              auVar25._4_4_ = *(float *)(*pauVar8 + 4) + *(float *)(*pauVar6 + 4);
              auVar25._8_4_ = *(float *)(*pauVar8 + 8) + *(float *)(*pauVar6 + 8);
              auVar25._12_4_ = *(float *)(*pauVar8 + 0xc) + *(float *)(*pauVar6 + 0xc);
              auVar25._16_4_ = *(float *)(*pauVar8 + 0x10) + *(float *)(*pauVar6 + 0x10);
              auVar25._20_4_ = *(float *)(*pauVar8 + 0x14) + *(float *)(*pauVar6 + 0x14);
              auVar25._24_4_ = *(float *)(*pauVar8 + 0x18) + *(float *)(*pauVar6 + 0x18);
              auVar25._28_4_ = *(float *)(*pauVar8 + 0x1c) + *(float *)(*pauVar6 + 0x1c);
              *(undefined1 (*) [32])*pauVar10 = auVar25;
              pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x20);
              pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
              pauVar10 = (undefined1 (*) [64])((long)*pauVar10 + 0x20);
              uVar13 = uVar14 + 0xf;
              uVar14 = uVar14 + 8;
            }
            uVar13 = uVar14 | 3;
            while ((int)uVar13 < (int)uVar5) {
              auVar23._0_4_ = *(float *)*pauVar8 + *(float *)*pauVar6;
              auVar23._4_4_ = *(float *)(*pauVar8 + 4) + *(float *)(*pauVar6 + 4);
              auVar23._8_4_ = *(float *)(*pauVar8 + 8) + *(float *)(*pauVar6 + 8);
              auVar23._12_4_ = *(float *)(*pauVar8 + 0xc) + *(float *)(*pauVar6 + 0xc);
              *(undefined1 (*) [16])*pauVar10 = auVar23;
              pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x10);
              pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
              pauVar10 = (undefined1 (*) [64])((long)*pauVar10 + 0x10);
              uVar13 = uVar14 + 7;
              uVar14 = uVar14 + 4;
            }
            if (uVar5 - uVar14 != 0 && (int)uVar14 <= (int)uVar5) {
              lVar12 = 0;
              do {
                *(float *)((long)*pauVar10 + lVar12 * 4) =
                     *(float *)(*pauVar8 + lVar12 * 4) + *(float *)(*pauVar6 + lVar12 * 4);
                lVar12 = lVar12 + 1;
              } while (uVar5 - uVar14 != (int)lVar12);
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 != uVar15);
        }
        pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar7 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar4 = 2;
          do {
            if (0 < (int)uVar1) {
              pMVar7 = pMVar7 + uVar4;
              uVar9 = 0;
              do {
                pauVar6 = (undefined1 (*) [64])
                          (pMVar7->cstep * uVar9 * pMVar7->elemsize + (long)pMVar7->data);
                pauVar8 = (undefined1 (*) [64])
                          (this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
                uVar14 = 0;
                if (0xf < (int)uVar5) {
                  iVar11 = 0xf;
                  do {
                    auVar16 = vaddps_avx512f(*pauVar6,*pauVar8);
                    *pauVar8 = auVar16;
                    pauVar6 = pauVar6 + 1;
                    pauVar8 = pauVar8 + 1;
                    iVar11 = iVar11 + 0x10;
                    uVar14 = uVar5 & 0xfffffff0;
                  } while (iVar11 < (int)uVar5);
                }
                uVar13 = uVar14 | 7;
                while ((int)uVar13 < (int)uVar5) {
                  auVar26._0_4_ = *(float *)*pauVar6 + *(float *)*pauVar8;
                  auVar26._4_4_ = *(float *)(*pauVar6 + 4) + *(float *)(*pauVar8 + 4);
                  auVar26._8_4_ = *(float *)(*pauVar6 + 8) + *(float *)(*pauVar8 + 8);
                  auVar26._12_4_ = *(float *)(*pauVar6 + 0xc) + *(float *)(*pauVar8 + 0xc);
                  auVar26._16_4_ = *(float *)(*pauVar6 + 0x10) + *(float *)(*pauVar8 + 0x10);
                  auVar26._20_4_ = *(float *)(*pauVar6 + 0x14) + *(float *)(*pauVar8 + 0x14);
                  auVar26._24_4_ = *(float *)(*pauVar6 + 0x18) + *(float *)(*pauVar8 + 0x18);
                  auVar26._28_4_ = *(float *)(*pauVar6 + 0x1c) + *(float *)(*pauVar8 + 0x1c);
                  *(undefined1 (*) [32])*pauVar8 = auVar26;
                  pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x20);
                  pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
                  uVar13 = uVar14 + 0xf;
                  uVar14 = uVar14 + 8;
                }
                uVar13 = uVar14 | 3;
                while ((int)uVar13 < (int)uVar5) {
                  auVar24._0_4_ = *(float *)*pauVar6 + *(float *)*pauVar8;
                  auVar24._4_4_ = *(float *)(*pauVar6 + 4) + *(float *)(*pauVar8 + 4);
                  auVar24._8_4_ = *(float *)(*pauVar6 + 8) + *(float *)(*pauVar8 + 8);
                  auVar24._12_4_ = *(float *)(*pauVar6 + 0xc) + *(float *)(*pauVar8 + 0xc);
                  *(undefined1 (*) [16])*pauVar8 = auVar24;
                  pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x10);
                  pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
                  uVar13 = uVar14 + 7;
                  uVar14 = uVar14 + 4;
                }
                if (uVar5 - uVar14 != 0 && (int)uVar14 <= (int)uVar5) {
                  lVar12 = 0;
                  do {
                    *(float *)(*pauVar8 + lVar12 * 4) =
                         *(float *)(*pauVar8 + lVar12 * 4) + *(float *)(*pauVar6 + lVar12 * 4);
                    lVar12 = lVar12 + 1;
                  } while (uVar5 - uVar14 != (int)lVar12);
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != uVar15);
            }
            uVar4 = uVar4 + 1;
            pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          } while (uVar4 < (ulong)(((long)(bottom_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar7
                                   >> 3) * -0x71c71c71c71c71c7));
        }
      }
      else {
        if (0 < (int)uVar1) {
          uVar4 = 0;
          do {
            pauVar6 = (undefined1 (*) [64])(m->cstep * uVar4 * m->elemsize + (long)m->data);
            pauVar8 = (undefined1 (*) [64])
                      (pMVar7[1].cstep * uVar4 * pMVar7[1].elemsize + (long)pMVar7[1].data);
            pauVar10 = (undefined1 (*) [64])
                       (this_00->cstep * uVar4 * this_00->elemsize + (long)this_00->data);
            uVar9 = *(this->super_Eltwise).coeffs.data;
            auVar22._8_8_ = 0;
            auVar22._0_8_ = uVar9;
            auVar20 = vmovshdup_avx(auVar22);
            if ((int)uVar5 < 0x10) {
              uVar14 = 0;
            }
            else {
              auVar16 = vbroadcastss_avx512f(auVar22);
              in_ZMM3 = vbroadcastsd_avx512f(auVar20);
              iVar11 = 0xf;
              do {
                auVar17 = vmulps_avx512f(auVar16,*pauVar6);
                auVar17 = vfmadd231ps_avx512f(auVar17,in_ZMM3,*pauVar8);
                *pauVar10 = auVar17;
                pauVar6 = pauVar6 + 1;
                pauVar8 = pauVar8 + 1;
                pauVar10 = pauVar10 + 1;
                iVar11 = iVar11 + 0x10;
                uVar14 = uVar5 & 0xfffffff0;
              } while (iVar11 < (int)uVar5);
            }
            fVar18 = (float)uVar9;
            if ((int)(uVar14 | 7) < (int)uVar5) {
              auVar29._0_8_ = auVar20._0_8_;
              auVar29._8_8_ = auVar29._0_8_;
              auVar29._16_8_ = auVar29._0_8_;
              auVar29._24_8_ = auVar29._0_8_;
              uVar13 = uVar14;
              do {
                auVar16._0_4_ = fVar18 * *(float *)*pauVar6;
                auVar16._4_4_ = fVar18 * *(float *)(*pauVar6 + 4);
                auVar16._8_4_ = fVar18 * *(float *)(*pauVar6 + 8);
                auVar16._12_4_ = fVar18 * *(float *)(*pauVar6 + 0xc);
                auVar16._16_4_ = fVar18 * *(float *)(*pauVar6 + 0x10);
                auVar16._20_4_ = fVar18 * *(float *)(*pauVar6 + 0x14);
                auVar16._28_36_ = in_ZMM3._28_36_;
                auVar16._24_4_ = fVar18 * *(float *)(*pauVar6 + 0x18);
                auVar20 = vfmadd231ps_fma(auVar16._0_32_,auVar29,*(undefined1 (*) [32])*pauVar8);
                in_ZMM3 = ZEXT1664(auVar20);
                *(undefined1 (*) [32])*pauVar10 = ZEXT1632(auVar20);
                pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x20);
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
                pauVar10 = (undefined1 (*) [64])((long)*pauVar10 + 0x20);
                uVar14 = uVar13 + 8;
                iVar11 = uVar13 + 0xf;
                uVar13 = uVar14;
              } while (iVar11 < (int)uVar5);
            }
            if ((int)(uVar14 | 3) < (int)uVar5) {
              auVar20 = vshufps_avx(auVar22,auVar22,0x55);
              uVar13 = uVar14;
              do {
                auVar31._0_4_ = fVar18 * *(float *)*pauVar6;
                auVar31._4_4_ = fVar18 * *(float *)(*pauVar6 + 4);
                auVar31._8_4_ = fVar18 * *(float *)(*pauVar6 + 8);
                auVar31._12_4_ = fVar18 * *(float *)(*pauVar6 + 0xc);
                auVar21 = vfmadd231ps_fma(auVar31,auVar20,*(undefined1 (*) [16])*pauVar8);
                in_ZMM3 = ZEXT1664(auVar21);
                *(undefined1 (*) [16])*pauVar10 = auVar21;
                pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x10);
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
                pauVar10 = (undefined1 (*) [64])((long)*pauVar10 + 0x10);
                uVar14 = uVar13 + 4;
                iVar11 = uVar13 + 7;
                uVar13 = uVar14;
              } while (iVar11 < (int)uVar5);
            }
            if (uVar5 - uVar14 != 0 && (int)uVar14 <= (int)uVar5) {
              lVar12 = 0;
              do {
                auVar20 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar6 + lVar12 * 4)),
                                        ZEXT416(*(uint *)(*pauVar8 + lVar12 * 4)),0x10);
                auVar27._0_4_ = auVar20._0_4_ * fVar18;
                auVar27._4_4_ = auVar20._4_4_ * (float)(uVar9 >> 0x20);
                auVar27._8_4_ = auVar20._8_4_ * 0.0;
                auVar27._12_4_ = auVar20._12_4_ * 0.0;
                auVar20 = vhaddps_avx(auVar27,auVar27);
                *(int *)((long)*pauVar10 + lVar12 * 4) = auVar20._0_4_;
                lVar12 = lVar12 + 1;
              } while (uVar5 - uVar14 != (int)lVar12);
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 != uVar15);
        }
        pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar7 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar4 = 2;
          do {
            if (0 < (int)uVar1) {
              pMVar7 = pMVar7 + uVar4;
              uVar9 = 0;
              do {
                pauVar6 = (undefined1 (*) [64])
                          (pMVar7->cstep * uVar9 * pMVar7->elemsize + (long)pMVar7->data);
                pauVar8 = (undefined1 (*) [64])
                          (this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
                auVar16 = vbroadcastss_avx512f
                                    (ZEXT416(*(uint *)((long)(this->super_Eltwise).coeffs.data +
                                                      uVar4 * 4)));
                uVar14 = 0;
                if (0xf < (int)uVar5) {
                  iVar11 = 0xf;
                  do {
                    auVar17 = vfmadd213ps_avx512f(*pauVar6,auVar16,*pauVar8);
                    *pauVar8 = auVar17;
                    pauVar6 = pauVar6 + 1;
                    pauVar8 = pauVar8 + 1;
                    iVar11 = iVar11 + 0x10;
                    uVar14 = uVar5 & 0xfffffff0;
                  } while (iVar11 < (int)uVar5);
                }
                uVar19 = auVar16._0_4_;
                if ((int)(uVar14 | 7) < (int)uVar5) {
                  auVar30._4_4_ = uVar19;
                  auVar30._0_4_ = uVar19;
                  auVar30._8_4_ = uVar19;
                  auVar30._12_4_ = uVar19;
                  auVar30._16_4_ = uVar19;
                  auVar30._20_4_ = uVar19;
                  auVar30._24_4_ = uVar19;
                  auVar30._28_4_ = uVar19;
                  uVar13 = uVar14;
                  do {
                    auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])*pauVar6,auVar30,
                                              *(undefined1 (*) [32])*pauVar8);
                    *(undefined1 (*) [32])*pauVar8 = ZEXT1632(auVar20);
                    pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x20);
                    pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
                    uVar14 = uVar13 + 8;
                    iVar11 = uVar13 + 0xf;
                    uVar13 = uVar14;
                  } while (iVar11 < (int)uVar5);
                }
                if ((int)(uVar14 | 3) < (int)uVar5) {
                  auVar28._4_4_ = uVar19;
                  auVar28._0_4_ = uVar19;
                  auVar28._8_4_ = uVar19;
                  auVar28._12_4_ = uVar19;
                  uVar13 = uVar14;
                  do {
                    auVar20 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar6,auVar28,
                                              *(undefined1 (*) [16])*pauVar8);
                    *(undefined1 (*) [16])*pauVar8 = auVar20;
                    pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x10);
                    pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
                    uVar14 = uVar13 + 4;
                    iVar11 = uVar13 + 7;
                    uVar13 = uVar14;
                  } while (iVar11 < (int)uVar5);
                }
                if (uVar5 - uVar14 != 0 && (int)uVar14 <= (int)uVar5) {
                  lVar12 = 0;
                  do {
                    auVar20 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar6 + lVar12 * 4)),
                                              auVar16._0_16_,
                                              ZEXT416(*(uint *)(*pauVar8 + lVar12 * 4)));
                    *(int *)(*pauVar8 + lVar12 * 4) = auVar20._0_4_;
                    lVar12 = lVar12 + 1;
                  } while (uVar5 - uVar14 != (int)lVar12);
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != uVar15);
            }
            uVar4 = uVar4 + 1;
            pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          } while (uVar4 < (ulong)(((long)(bottom_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar7
                                   >> 3) * -0x71c71c71c71c71c7));
        }
      }
    }
    iVar11 = 0;
    if ((this->super_Eltwise).op_type == 2) {
      if (0 < (int)uVar1) {
        pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = 0;
        do {
          pauVar6 = (undefined1 (*) [64])(m->cstep * uVar4 * m->elemsize + (long)m->data);
          pauVar8 = (undefined1 (*) [64])
                    (pMVar7[1].cstep * uVar4 * pMVar7[1].elemsize + (long)pMVar7[1].data);
          pauVar10 = (undefined1 (*) [64])
                     (this_00->cstep * uVar4 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar5 < 0x10) {
            uVar14 = 0;
          }
          else {
            iVar11 = 0xf;
            do {
              auVar16 = vmaxps_avx512f(*pauVar6,*pauVar8);
              *pauVar10 = auVar16;
              pauVar6 = pauVar6 + 1;
              pauVar8 = pauVar8 + 1;
              pauVar10 = pauVar10 + 1;
              iVar11 = iVar11 + 0x10;
              uVar14 = uVar5 & 0xfffffff0;
            } while (iVar11 < (int)uVar5);
          }
          uVar13 = uVar14 | 7;
          while ((int)uVar13 < (int)uVar5) {
            auVar2 = vmaxps_avx(*(undefined1 (*) [32])*pauVar6,*(undefined1 (*) [32])*pauVar8);
            *(undefined1 (*) [32])*pauVar10 = auVar2;
            pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x20);
            pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
            pauVar10 = (undefined1 (*) [64])((long)*pauVar10 + 0x20);
            uVar13 = uVar14 + 0xf;
            uVar14 = uVar14 + 8;
          }
          uVar13 = uVar14 | 3;
          while ((int)uVar13 < (int)uVar5) {
            auVar20 = vmaxps_avx(*(undefined1 (*) [16])*pauVar6,*(undefined1 (*) [16])*pauVar8);
            *(undefined1 (*) [16])*pauVar10 = auVar20;
            pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x10);
            pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
            pauVar10 = (undefined1 (*) [64])((long)*pauVar10 + 0x10);
            uVar13 = uVar14 + 7;
            uVar14 = uVar14 + 4;
          }
          if (uVar5 - uVar14 != 0 && (int)uVar14 <= (int)uVar5) {
            lVar12 = 0;
            do {
              auVar20 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar8 + lVar12 * 4)),
                                   ZEXT416(*(uint *)(*pauVar6 + lVar12 * 4)));
              *(int *)((long)*pauVar10 + lVar12 * 4) = auVar20._0_4_;
              lVar12 = lVar12 + 1;
            } while (uVar5 - uVar14 != (int)lVar12);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar15);
      }
      pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar11 = 0;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar7 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar4 = 2;
        do {
          if (0 < (int)uVar1) {
            pMVar7 = pMVar7 + uVar4;
            uVar9 = 0;
            do {
              pauVar6 = (undefined1 (*) [64])
                        (pMVar7->cstep * uVar9 * pMVar7->elemsize + (long)pMVar7->data);
              pauVar8 = (undefined1 (*) [64])
                        (this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
              uVar14 = 0;
              if (0xf < (int)uVar5) {
                iVar11 = 0xf;
                do {
                  auVar16 = vmaxps_avx512f(*pauVar8,*pauVar6);
                  *pauVar8 = auVar16;
                  pauVar6 = pauVar6 + 1;
                  pauVar8 = pauVar8 + 1;
                  iVar11 = iVar11 + 0x10;
                  uVar14 = uVar5 & 0xfffffff0;
                } while (iVar11 < (int)uVar5);
              }
              uVar13 = uVar14 | 7;
              while ((int)uVar13 < (int)uVar5) {
                auVar2 = vmaxps_avx(*(undefined1 (*) [32])*pauVar8,*(undefined1 (*) [32])*pauVar6);
                *(undefined1 (*) [32])*pauVar8 = auVar2;
                pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x20);
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
                uVar13 = uVar14 + 0xf;
                uVar14 = uVar14 + 8;
              }
              uVar13 = uVar14 | 3;
              while ((int)uVar13 < (int)uVar5) {
                auVar20 = vmaxps_avx(*(undefined1 (*) [16])*pauVar8,*(undefined1 (*) [16])*pauVar6);
                *(undefined1 (*) [16])*pauVar8 = auVar20;
                pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x10);
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
                uVar13 = uVar14 + 7;
                uVar14 = uVar14 + 4;
              }
              if (uVar5 - uVar14 != 0 && (int)uVar14 <= (int)uVar5) {
                lVar12 = 0;
                do {
                  auVar20 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar8 + lVar12 * 4)),
                                       ZEXT416(*(uint *)(*pauVar6 + lVar12 * 4)));
                  *(int *)(*pauVar8 + lVar12 * 4) = auVar20._0_4_;
                  lVar12 = lVar12 + 1;
                } while (uVar5 - uVar14 != (int)lVar12);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar15);
          }
          uVar4 = uVar4 + 1;
          pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        } while (uVar4 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7 >>
                                 3) * -0x71c71c71c71c71c7));
        iVar11 = 0;
      }
    }
  }
  return iVar11;
}

Assistant:

int Eltwise_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}